

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>::
emplaceRealloc<slang::ast::PortSymbol::NetTypeRange>
          (SmallVectorBase<slang::ast::PortSymbol::NetTypeRange> *this,pointer pos,
          NetTypeRange *args)

{
  ulong uVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  bitwidth_t bVar4;
  undefined4 uVar5;
  NetTypeRange *__cur_1;
  pointer pNVar6;
  pointer pNVar7;
  pointer pNVar8;
  pointer pNVar9;
  EVP_PKEY_CTX *pEVar10;
  EVP_PKEY_CTX *ctx;
  long lVar11;
  
  if (this->len == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  pEVar10 = (EVP_PKEY_CTX *)(this->len + 1);
  uVar1 = this->cap;
  ctx = (EVP_PKEY_CTX *)(uVar1 * 2);
  if (pEVar10 < ctx) {
    pEVar10 = ctx;
  }
  if (0x7ffffffffffffff - uVar1 < uVar1) {
    pEVar10 = (EVP_PKEY_CTX *)0x7ffffffffffffff;
  }
  lVar11 = (long)pos - (long)this->data_;
  pNVar6 = (pointer)operator_new((long)pEVar10 << 4);
  uVar3 = *(undefined8 *)&args->width;
  *(undefined8 *)((long)pNVar6 + lVar11) = args->netType;
  ((undefined8 *)((long)pNVar6 + lVar11))[1] = uVar3;
  pNVar9 = this->data_;
  pNVar7 = pNVar9 + this->len;
  pNVar8 = pNVar6;
  if (pNVar7 == pos) {
    for (; pNVar9 != pos; pNVar9 = pNVar9 + 1) {
      bVar4 = pNVar9->width;
      uVar5 = *(undefined4 *)&pNVar9->field_0xc;
      pNVar8->netType = pNVar9->netType;
      pNVar8->width = bVar4;
      *(undefined4 *)&pNVar8->field_0xc = uVar5;
      pNVar8 = pNVar8 + 1;
    }
  }
  else {
    for (; pNVar9 != pos; pNVar9 = pNVar9 + 1) {
      bVar4 = pNVar9->width;
      uVar5 = *(undefined4 *)&pNVar9->field_0xc;
      pNVar8->netType = pNVar9->netType;
      pNVar8->width = bVar4;
      *(undefined4 *)&pNVar8->field_0xc = uVar5;
      pNVar8 = pNVar8 + 1;
    }
    puVar2 = (undefined8 *)(lVar11 + (long)pNVar6);
    for (; pos != pNVar7; pos = pos + 1) {
      uVar3 = *(undefined8 *)&pos->width;
      puVar2[2] = pos->netType;
      puVar2[3] = uVar3;
      puVar2 = puVar2 + 2;
    }
  }
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = (size_type)pEVar10;
  this->data_ = pNVar6;
  return (pointer)((long)pNVar6 + lVar11);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}